

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_limit_aspect_ratio_field(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *aspect_ratio_field)

{
  uint uVar1;
  REF_NODE pRVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  REF_DBL diag_system [12];
  double local_98;
  double local_90;
  double local_88;
  
  pRVar2 = ref_grid->node;
  if (ref_grid->twod == 0) {
    if (0 < pRVar2->max) {
      lVar3 = 0;
      do {
        if (-1 < pRVar2->global[lVar3]) {
          dVar7 = aspect_ratio_field[lVar3];
          uVar1 = ref_matrix_diag_m(metric,&local_98);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x825,"ref_metric_limit_aspect_ratio_field",(ulong)uVar1,"eigen decomp");
            return uVar1;
          }
          dVar4 = local_90;
          if (local_90 <= local_98) {
            dVar4 = local_98;
          }
          dVar5 = local_88;
          if (local_88 <= dVar4) {
            dVar5 = dVar4;
          }
          dVar7 = dVar7 * dVar7;
          dVar4 = dVar7 * 1e+20;
          if (dVar4 <= -dVar4) {
            dVar4 = -dVar4;
          }
          dVar6 = dVar5;
          if (dVar5 <= -dVar5) {
            dVar6 = -dVar5;
          }
          if (dVar6 < dVar4) {
            dVar5 = dVar5 / dVar7;
            if (local_98 <= dVar5) {
              local_98 = dVar5;
            }
            if (local_90 <= dVar5) {
              local_90 = dVar5;
            }
            if (local_88 <= dVar5) {
              local_88 = dVar5;
            }
            uVar1 = ref_matrix_form_m(&local_98,metric);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x831,"ref_metric_limit_aspect_ratio_field",(ulong)uVar1,"reform m");
              return uVar1;
            }
          }
        }
        lVar3 = lVar3 + 1;
        pRVar2 = ref_grid->node;
        metric = metric + 6;
      } while (lVar3 < pRVar2->max);
    }
  }
  else if (0 < pRVar2->max) {
    lVar3 = 0;
    do {
      if (-1 < pRVar2->global[lVar3]) {
        dVar7 = aspect_ratio_field[lVar3];
        uVar1 = ref_matrix_diag_m(metric,&local_98);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x813,"ref_metric_limit_aspect_ratio_field",(ulong)uVar1,"eigen decomp");
          return uVar1;
        }
        uVar1 = ref_matrix_descending_eig_twod(&local_98);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x814,"ref_metric_limit_aspect_ratio_field",(ulong)uVar1,"2D eig sort");
          return uVar1;
        }
        dVar4 = local_90;
        if (local_90 <= local_98) {
          dVar4 = local_98;
        }
        dVar7 = dVar7 * dVar7;
        dVar5 = dVar7 * 1e+20;
        if (dVar5 <= -dVar5) {
          dVar5 = -dVar5;
        }
        dVar6 = dVar4;
        if (dVar4 <= -dVar4) {
          dVar6 = -dVar4;
        }
        if (dVar6 < dVar5) {
          dVar4 = dVar4 / dVar7;
          if (local_98 <= dVar4) {
            local_98 = dVar4;
          }
          if (local_90 <= dVar4) {
            local_90 = dVar4;
          }
          uVar1 = ref_matrix_form_m(&local_98,metric);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x81d,"ref_metric_limit_aspect_ratio_field",(ulong)uVar1,"reform m");
            return uVar1;
          }
          uVar1 = ref_matrix_twod_m(metric);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x81f,"ref_metric_limit_aspect_ratio_field",(ulong)uVar1,
                   "enforce 2D m for roundoff");
            return uVar1;
          }
        }
      }
      lVar3 = lVar3 + 1;
      pRVar2 = ref_grid->node;
      metric = metric + 6;
    } while (lVar3 < pRVar2->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_limit_aspect_ratio_field(
    REF_DBL *metric, REF_GRID ref_grid, REF_DBL *aspect_ratio_field) {
  REF_DBL diag_system[12];
  REF_DBL max_eig, limit_eig;
  REF_INT node;
  REF_DBL aspect_ratio;
  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      aspect_ratio = aspect_ratio_field[node];
      RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
      RSS(ref_matrix_descending_eig_twod(diag_system), "2D eig sort");
      max_eig = ref_matrix_eig(diag_system, 0);
      max_eig = MAX(ref_matrix_eig(diag_system, 1), max_eig);
      if (ref_math_divisible(max_eig, (aspect_ratio * aspect_ratio))) {
        limit_eig = max_eig / (aspect_ratio * aspect_ratio);
        ref_matrix_eig(diag_system, 0) =
            MAX(ref_matrix_eig(diag_system, 0), limit_eig);
        ref_matrix_eig(diag_system, 1) =
            MAX(ref_matrix_eig(diag_system, 1), limit_eig);
        RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
        RSS(ref_matrix_twod_m(&(metric[6 * node])),
            "enforce 2D m for roundoff");
      }
    }
  } else {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      aspect_ratio = aspect_ratio_field[node];
      RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
      max_eig = ref_matrix_eig(diag_system, 0);
      max_eig = MAX(ref_matrix_eig(diag_system, 1), max_eig);
      max_eig = MAX(ref_matrix_eig(diag_system, 2), max_eig);
      if (ref_math_divisible(max_eig, (aspect_ratio * aspect_ratio))) {
        limit_eig = max_eig / (aspect_ratio * aspect_ratio);
        ref_matrix_eig(diag_system, 0) =
            MAX(ref_matrix_eig(diag_system, 0), limit_eig);
        ref_matrix_eig(diag_system, 1) =
            MAX(ref_matrix_eig(diag_system, 1), limit_eig);
        ref_matrix_eig(diag_system, 2) =
            MAX(ref_matrix_eig(diag_system, 2), limit_eig);
        RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
      }
    }
  }
  return REF_SUCCESS;
}